

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O3

int fe_write_frame(fe_t *fe,mfcc_t *feat)

{
  byte bVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  double *pdVar5;
  frame_t *pfVar6;
  frame_t *pfVar7;
  powspec_t *ppVar8;
  melfb_t *pmVar9;
  powspec_t *ppVar10;
  int16 *piVar11;
  int16 *piVar12;
  int16 *piVar13;
  mfcc_t *pmVar14;
  powspec_t *spec;
  long lVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  double *pdVar19;
  uint uVar20;
  int iVar21;
  double *pdVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  int iVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  
  pdVar5 = (double *)fe->frame;
  bVar1 = fe->fft_order;
  sVar2 = fe->fft_size;
  uVar20 = (uint)sVar2;
  uVar29 = (ulong)(int)uVar20;
  if (1 < (int)uVar20) {
    uVar18 = 0;
    iVar26 = 0;
    do {
      lVar25 = (long)iVar26;
      uVar27 = uVar20;
      if ((long)uVar18 < lVar25) {
        dVar31 = pdVar5[lVar25];
        pdVar5[lVar25] = pdVar5[uVar18];
        pdVar5[uVar18] = dVar31;
      }
      do {
        iVar21 = iVar26;
        uVar27 = (int)uVar27 / 2;
        iVar26 = iVar21 - uVar27;
      } while ((int)uVar27 <= iVar21);
      iVar26 = iVar21 + uVar27;
      uVar18 = uVar18 + 1;
    } while (uVar18 != uVar20 - 1);
  }
  if (0 < sVar2) {
    uVar18 = 0;
    do {
      dVar31 = pdVar5[uVar18];
      pdVar5[uVar18] = dVar31 + pdVar5[uVar18 + 1];
      pdVar5[uVar18 + 1] = dVar31 - pdVar5[uVar18 + 1];
      uVar18 = uVar18 + 2;
    } while (uVar18 < uVar29);
  }
  if (1 < bVar1) {
    uVar27 = 1;
    do {
      uVar17 = uVar27 + 1;
      if (0 < sVar2) {
        bVar16 = (byte)uVar27;
        iVar26 = 1 << (bVar16 & 0x1f);
        uVar27 = 1 << (bVar16 - 1 & 0x1f);
        iVar23 = 2 << (bVar16 & 0x1f);
        lVar25 = (long)iVar23;
        pdVar22 = pdVar5 + iVar26;
        iVar21 = iVar26 * 2 + -1;
        lVar24 = 0;
        pdVar19 = pdVar5;
        do {
          lVar15 = iVar26 + lVar24;
          dVar31 = pdVar5[lVar24];
          dVar32 = pdVar5[lVar15];
          pdVar5[lVar24] = dVar31 + dVar32;
          pdVar5[lVar15] = dVar31 - dVar32;
          pdVar5[(int)uVar27 + lVar15] = -pdVar5[(int)uVar27 + lVar15];
          if (1 < (int)uVar27) {
            pfVar6 = fe->ccc;
            pfVar7 = fe->sss;
            uVar18 = 1;
            lVar15 = 0;
            do {
              iVar28 = (int)uVar18 << (bVar1 - (char)uVar17 & 0x1f);
              iVar30 = iVar21 + (int)lVar15;
              dVar33 = pdVar22[uVar18] * (double)pfVar6[iVar28] +
                       (double)pfVar7[iVar28] * pdVar5[iVar30];
              dVar32 = pdVar22[uVar18] * (double)pfVar7[iVar28] -
                       (double)pfVar6[iVar28] * pdVar5[iVar30];
              dVar31 = pdVar22[lVar15 + -1];
              pdVar5[iVar30] = dVar31 - dVar32;
              pdVar22[uVar18] = -dVar31 - dVar32;
              pdVar22[lVar15 + -1] = pdVar19[uVar18] - dVar33;
              pdVar19[uVar18] = dVar33 + pdVar19[uVar18];
              uVar18 = uVar18 + 1;
              lVar15 = lVar15 + -1;
            } while (uVar27 != uVar18);
          }
          lVar24 = lVar24 + lVar25;
          pdVar19 = pdVar19 + lVar25;
          pdVar22 = pdVar22 + lVar25;
          iVar21 = iVar21 + iVar23;
        } while (lVar24 < (long)uVar29);
      }
      uVar27 = uVar17;
    } while (bVar1 != uVar17);
  }
  ppVar8 = fe->spec;
  *ppVar8 = (powspec_t)(*pdVar5 * *pdVar5);
  if (1 < sVar2) {
    pdVar22 = pdVar5 + uVar29;
    lVar25 = 0;
    do {
      pdVar22 = pdVar22 + -1;
      ppVar8[lVar25 + 1] =
           (powspec_t)(pdVar5[lVar25 + 1] * pdVar5[lVar25 + 1] + *pdVar22 * *pdVar22);
      lVar25 = lVar25 + 1;
    } while ((ulong)(uVar20 >> 1) + (ulong)((ulong)(uVar20 >> 1) == 0) != lVar25);
  }
  pmVar9 = fe->mel_fb;
  iVar26 = pmVar9->num_filters;
  if (0 < (long)iVar26) {
    ppVar10 = fe->mfspec;
    piVar11 = pmVar9->spec_start;
    piVar12 = pmVar9->filt_start;
    piVar13 = pmVar9->filt_width;
    lVar25 = 0;
    do {
      sVar2 = piVar11[lVar25];
      sVar3 = piVar12[lVar25];
      ppVar10[lVar25] = 0.0;
      sVar4 = piVar13[lVar25];
      if (0 < (long)sVar4) {
        pmVar14 = pmVar9->filt_coeffs;
        dVar31 = 0.0;
        lVar24 = 0;
        do {
          dVar31 = dVar31 + (double)(float)pmVar14[sVar3 + lVar24] * (double)ppVar8[sVar2 + lVar24];
          ppVar10[lVar25] = (powspec_t)dVar31;
          lVar24 = lVar24 + 1;
        } while (sVar4 != lVar24);
      }
      lVar25 = lVar25 + 1;
    } while (lVar25 != iVar26);
  }
  fe_remove_noise(fe);
  ppVar8 = fe->mfspec;
  if (0 < fe->mel_fb->num_filters) {
    lVar25 = 0;
    do {
      dVar31 = log((double)ppVar8[lVar25] + 0.0001);
      ppVar8[lVar25] = (powspec_t)dVar31;
      lVar25 = lVar25 + 1;
    } while (lVar25 < fe->mel_fb->num_filters);
  }
  if (fe->log_spec == '\x02') {
    fe_dct2(fe,ppVar8,feat,0);
    fe_dct3(fe,feat,ppVar8);
    bVar1 = fe->feature_dimension;
    if ((ulong)bVar1 != 0) {
      uVar29 = 0;
      do {
        feat[uVar29] = (mfcc_t)(float)(double)ppVar8[uVar29];
        uVar29 = uVar29 + 1;
      } while (bVar1 != uVar29);
    }
  }
  else if (fe->log_spec == '\x01') {
    bVar1 = fe->feature_dimension;
    if ((ulong)bVar1 != 0) {
      uVar29 = 0;
      do {
        feat[uVar29] = (mfcc_t)(float)(double)ppVar8[uVar29];
        uVar29 = uVar29 + 1;
      } while (bVar1 != uVar29);
    }
  }
  else {
    if (fe->transform == '\x02') {
      iVar26 = 1;
    }
    else {
      if (fe->transform != '\x01') {
        fe_spec2cep(fe,ppVar8,feat);
        goto LAB_001490ad;
      }
      iVar26 = 0;
    }
    fe_dct2(fe,ppVar8,feat,iVar26);
  }
LAB_001490ad:
  if ((fe->mel_fb->lifter_val != 0) && (bVar1 = fe->num_cepstra, (ulong)bVar1 != 0)) {
    pmVar14 = fe->mel_fb->lifter;
    uVar29 = 0;
    do {
      feat[uVar29] = (mfcc_t)((float)feat[uVar29] * (float)pmVar14[uVar29]);
      uVar29 = uVar29 + 1;
    } while (bVar1 != uVar29);
  }
  return 1;
}

Assistant:

static int
fe_fft_real(fe_t *fe)
{
    int i, j, k, m, n;
    frame_t *x, xt;

    x = fe->frame;
    m = fe->fft_order;
    n = fe->fft_size;

    /* Bit-reverse the input. */
    j = 0;
    for (i = 0; i < n - 1; ++i) {
        if (i < j) {
            xt = x[j];
            x[j] = x[i];
            x[i] = xt;
        }
        k = n / 2;
        while (k <= j) {
            j -= k;
            k /= 2;
        }
        j += k;
    }

    /* Basic butterflies (2-point FFT, real twiddle factors):
     * x[i]   = x[i] +  1 * x[i+1]
     * x[i+1] = x[i] + -1 * x[i+1]
     */
    for (i = 0; i < n; i += 2) {
        xt = x[i];
        x[i] = (xt + x[i + 1]);
        x[i + 1] = (xt - x[i + 1]);
    }

    /* The rest of the butterflies, in stages from 1..m */
    for (k = 1; k < m; ++k) {
        int n1, n2, n4;

        n4 = k - 1;
        n2 = k;
        n1 = k + 1;
        /* Stride over each (1 << (k+1)) points */
        for (i = 0; i < n; i += (1 << n1)) {
            /* Basic butterfly with real twiddle factors:
             * x[i]          = x[i] +  1 * x[i + (1<<k)]
             * x[i + (1<<k)] = x[i] + -1 * x[i + (1<<k)]
             */
            xt = x[i];
            x[i] = (xt + x[i + (1 << n2)]);
            x[i + (1 << n2)] = (xt - x[i + (1 << n2)]);

            /* The other ones with real twiddle factors:
             * x[i + (1<<k) + (1<<(k-1))]
             *   = 0 * x[i + (1<<k-1)] + -1 * x[i + (1<<k) + (1<<k-1)]
             * x[i + (1<<(k-1))]
             *   = 1 * x[i + (1<<k-1)] +  0 * x[i + (1<<k) + (1<<k-1)]
             */
            x[i + (1 << n2) + (1 << n4)] = -x[i + (1 << n2) + (1 << n4)];
            x[i + (1 << n4)] = x[i + (1 << n4)];

            /* Butterflies with complex twiddle factors.
             * There are (1<<k-1) of them.
             */
            for (j = 1; j < (1 << n4); ++j) {
                frame_t cc, ss, t1, t2;
                int i1, i2, i3, i4;

                i1 = i + j;
                i2 = i + (1 << n2) - j;
                i3 = i + (1 << n2) + j;
                i4 = i + (1 << n2) + (1 << n2) - j;

                /*
                 * cc = real(W[j * n / (1<<(k+1))])
                 * ss = imag(W[j * n / (1<<(k+1))])
                 */
                cc = fe->ccc[j << (m - n1)];
                ss = fe->sss[j << (m - n1)];

                /* There are some symmetry properties which allow us
                 * to get away with only four multiplications here. */
                t1 = COSMUL(x[i3], cc) + COSMUL(x[i4], ss);
                t2 = COSMUL(x[i3], ss) - COSMUL(x[i4], cc);

                x[i4] = (x[i2] - t2);
                x[i3] = (-x[i2] - t2);
                x[i2] = (x[i1] - t1);
                x[i1] = (x[i1] + t1);
            }
        }
    }

    /* This isn't used, but return it for completeness. */
    return m;
}